

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GetterReturnType_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  bool bVar1;
  byte local_73;
  byte local_71;
  Type local_58;
  undefined1 local_25;
  BaseType local_24;
  FieldDef *pFStack_20;
  BaseType base_type;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  string *r_type;
  
  local_24 = (field->value).type.base_type;
  local_25 = 0;
  pFStack_20 = field;
  field_local = (FieldDef *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&(field->value).type);
  bVar1 = FieldDef::IsScalarOptional(pFStack_20);
  local_71 = 1;
  if ((!bVar1) &&
     ((bVar1 = FieldDef::IsRequired(pFStack_20), bVar1 ||
      (((local_71 = 1, local_24 != BASE_TYPE_STRING && (local_71 = 1, local_24 != BASE_TYPE_STRUCT))
       && (local_71 = 1, local_24 != BASE_TYPE_UNION)))))) {
    local_73 = 0;
    if (local_24 == BASE_TYPE_VECTOR) {
      bVar1 = FieldDef::IsRequired(pFStack_20);
      local_73 = 0;
      if (!bVar1) {
        Type::VectorType(&local_58,&(pFStack_20->value).type);
        bVar1 = IsScalar(local_58.base_type);
        local_73 = bVar1 ^ 0xff;
      }
    }
    local_71 = local_73;
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetterReturnType(const FieldDef &field) const {
    auto base_type = field.value.type.base_type;

    auto r_type = GenTypeGet(field.value.type);
    if (field.IsScalarOptional() ||
        // string, structs and unions
        (!field.IsRequired() &&
         (base_type == BASE_TYPE_STRING || base_type == BASE_TYPE_STRUCT ||
          base_type == BASE_TYPE_UNION)) ||
        // vector of anything not scalar
        (base_type == BASE_TYPE_VECTOR && !field.IsRequired() &&
         !IsScalar(field.value.type.VectorType().base_type))) {
      r_type += "?";
    }
    return r_type;
  }